

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O0

TA_RetCode
TA_MAVP_FramePP(TA_ParamHolderPriv *params,int startIdx,int endIdx,int *outBegIdx,int *outNBElement)

{
  TA_RetCode TVar1;
  int unaff_retaddr;
  int unaff_retaddr_00;
  double *in_stack_00000008;
  double *in_stack_00000010;
  int in_stack_0000001c;
  int *in_stack_00000040;
  double *in_stack_00000048;
  
  TVar1 = TA_MAVP((int)outNBElement,in_stack_0000001c,in_stack_00000010,in_stack_00000008,
                  unaff_retaddr_00,unaff_retaddr,endIdx,(int *)params,in_stack_00000040,
                  in_stack_00000048);
  return TVar1;
}

Assistant:

TA_RetCode TA_MAVP_FramePP( const TA_ParamHolderPriv *params,
/* Generated */                           int            startIdx,
/* Generated */                           int            endIdx,
/* Generated */                           int           *outBegIdx,
/* Generated */                           int           *outNBElement )
/* Generated */ {
/* Generated */    return TA_MAVP(
/* Generated */              startIdx,
/* Generated */              endIdx,
/* Generated */              params->in[0].data.inReal, /* inReal */
/* Generated */              params->in[1].data.inReal, /* inPeriods */
/* Generated */              params->optIn[0].data.optInInteger, /* optInMinPeriod*/
/* Generated */              params->optIn[1].data.optInInteger, /* optInMaxPeriod*/
/* Generated */              (TA_MAType)params->optIn[2].data.optInInteger, /* optInMAType*/
/* Generated */              outBegIdx, 
/* Generated */              outNBElement, 
/* Generated */              params->out[0].data.outReal /*  outReal */ );
/* Generated */ }